

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint value;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    bVar1 = this->field_0xa;
    iVar2 = 0;
    if ((bVar1 & 1) == 0) {
      iVar2 = 1;
      iVar3 = 1;
      if (0x7f < (uint)number) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(number);
        bVar1 = this->field_0xa;
      }
      value = (**(code **)(((this->field_0).repeated_int32_value)->elements_ +
                          (ulong)((bVar1 & 0x10) == 0) * 2 + 0x10))();
      if (0x7f < value) {
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(value);
      }
      iVar2 = iVar3 + 4 + value + iVar2;
    }
    return iVar2;
  }
  iVar2 = ByteSize(this,number);
  return iVar2;
}

Assistant:

int ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  int our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  int message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}